

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O2

String * Rct::colorize(String *__return_storage_ptr__,String *string,AnsiColor color,size_t from,
                      size_t len)

{
  ulong uVar1;
  size_t len_00;
  char *str;
  size_t len_01;
  
  uVar1 = (string->mString)._M_string_length;
  if (uVar1 < from) {
    __assert_fail("from <= string.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Rct.cpp",
                  0x1b7,"String Rct::colorize(const String &, AnsiColor, size_t, size_t)");
  }
  len_01 = uVar1 - from;
  if (len != 0xffffffffffffffff) {
    len_01 = len;
  }
  if (len_01 + from <= uVar1) {
    if (len_01 == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)string);
    }
    else {
      (__return_storage_ptr__->mString)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mString).field_2;
      (__return_storage_ptr__->mString)._M_string_length = 0;
      (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      str = (string->mString)._M_dataplus._M_p;
      if (from != 0) {
        String::append(__return_storage_ptr__,str,from);
        str = str + from;
      }
      String::append(__return_storage_ptr__,(&colors)[color],0xffffffffffffffff);
      String::append(__return_storage_ptr__,str,len_01);
      String::append(__return_storage_ptr__,colors,0xffffffffffffffff);
      len_00 = (string->mString)._M_string_length - (len_01 + from);
      if (len_00 != 0) {
        String::append(__return_storage_ptr__,str + len_01,len_00);
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("from + len <= string.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Rct.cpp",
                0x1bb,"String Rct::colorize(const String &, AnsiColor, size_t, size_t)");
}

Assistant:

String colorize(const String &string, AnsiColor color, size_t from, size_t len)
{
    assert(from <= string.size());
    if (len == String::npos) {
        len = string.size() - from;
    }
    assert(from + len <= string.size());
    if (!len)
        return string;

    String ret;
    ret.reserve(string.size() + 20);
    const char *str = string.constData();
    if (from > 0) {
        ret.append(str, from);
        str += from;
    }
    ret.append(colors[color]);
    ret.append(str, len);
    str += len;
    ret.append(colors[AnsiColor_Default]);
    if (from + len != string.size())
        ret.append(str, string.size() - from - len);

    return ret;
}